

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O3

void __thiscall WriteIncludesBase::acceptAction(WriteIncludesBase *this,DomAction *node)

{
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = L"QAction";
  local_38.d.size = 7;
  add(this,&local_38,(DomCustomWidget *)0x0);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  TreeWalker::acceptAction(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptAction(DomAction *node)
{
    add(QStringLiteral("QAction"));
    TreeWalker::acceptAction(node);
}